

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

ssize_t __thiscall
Lodtalk::MethodAssembler::Assembler::send
          (Assembler *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Oop OVar1;
  size_t sVar2;
  InstructionNode *pIVar3;
  undefined4 in_register_00000034;
  anon_union_8_4_0eb573b0_for_Oop_0 newLiteral;
  SpecialMessageSelector selectorIndex;
  
  newLiteral.uintValue._4_4_ = in_register_00000034;
  newLiteral.intValue._0_4_ = __fd;
  selectorIndex = Add;
  do {
    if (selectorIndex == BasicNew) {
      pIVar3 = (InstructionNode *)operator_new(0x30);
      sVar2 = addLiteral(this,(Oop)newLiteral);
      pIVar3->position = 0;
      pIVar3->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00171478;
      *(int *)&pIVar3[1]._vptr_InstructionNode = (int)sVar2;
      *(int *)((long)&pIVar3[1]._vptr_InstructionNode + 4) = (int)__buf;
LAB_0014b06e:
      pIVar3 = addInstruction(this,pIVar3);
      return (ssize_t)pIVar3;
    }
    OVar1 = VMContext::getSpecialMessageSelector(this->context,selectorIndex);
    if (OVar1.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)newLiteral.pointer) {
      pIVar3 = (InstructionNode *)operator_new(0x30);
      pIVar3->position = 0;
      pIVar3->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00170ef8;
      *(SpecialMessageSelector *)&pIVar3[1]._vptr_InstructionNode = selectorIndex + 0x60;
      *(undefined1 *)((long)&pIVar3[1]._vptr_InstructionNode + 4) = 0;
      goto LAB_0014b06e;
    }
    selectorIndex = selectorIndex + Minus;
  } while( true );
}

Assistant:

InstructionNode *Assembler::send(Oop selector, int argumentCount)
{
    for(int i = 0; i < (int)SpecialMessageSelector::SpecialMessageOptimizedCount; ++i)
    {
        auto specialSelector = context->getSpecialMessageSelector(SpecialMessageSelector(i));
        if(selector == specialSelector)
            return addInstruction(new SingleBytecodeInstruction(BytecodeSet::SpecialMessageAdd + i, false));
    }
	return addInstruction(new SendMessage((int)addLiteral(selector), argumentCount));
}